

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

wl_display * glfwGetWaylandDisplay(void)

{
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (_glfw.platform.platformID == 0x60003) {
      return _glfw.wl.display;
    }
    format = "Wayland: Platform not initialized";
    code = 0x1000e;
  }
  _glfwInputError(code,format);
  return (wl_display *)0x0;
}

Assistant:

wl_display* glfwGetWaylandDisplay(void)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_WAYLAND)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE,
                        "Wayland: Platform not initialized");
        return NULL;
    }

    return _glfw.wl.display;
}